

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O1

int __thiscall miniros::NodeHandle::shutdown(NodeHandle *this,int __fd,int __how)

{
  int iVar1;
  uint uVar2;
  pointer pwVar3;
  Impl *this_00;
  pointer pwVar4;
  Impl *this_01;
  pointer pwVar5;
  Impl *this_02;
  pointer pwVar6;
  Impl *this_03;
  int iVar7;
  uint uVar8;
  NodeHandleBackingCollection *pNVar9;
  NodeHandleBackingCollection *extraout_RAX;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  pointer pwVar11;
  pointer pwVar12;
  pointer pwVar13;
  pointer pwVar14;
  bool bVar15;
  
  pwVar11 = (this->collection_->subs_).
            super__Vector_base<std::weak_ptr<miniros::Subscriber::Impl>,_std::allocator<std::weak_ptr<miniros::Subscriber::Impl>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pwVar3 = (this->collection_->subs_).
           super__Vector_base<std::weak_ptr<miniros::Subscriber::Impl>,_std::allocator<std::weak_ptr<miniros::Subscriber::Impl>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pwVar11 == pwVar3) {
      pwVar12 = (this->collection_->pubs_).
                super__Vector_base<std::weak_ptr<miniros::Publisher::Impl>,_std::allocator<std::weak_ptr<miniros::Publisher::Impl>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pwVar4 = (this->collection_->pubs_).
               super__Vector_base<std::weak_ptr<miniros::Publisher::Impl>,_std::allocator<std::weak_ptr<miniros::Publisher::Impl>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      do {
        if (pwVar12 == pwVar4) {
          pwVar13 = (this->collection_->srvs_).
                    super__Vector_base<std::weak_ptr<miniros::ServiceServer::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceServer::Impl>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pwVar5 = (this->collection_->srvs_).
                   super__Vector_base<std::weak_ptr<miniros::ServiceServer::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceServer::Impl>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          do {
            if (pwVar13 == pwVar5) {
              pNVar9 = this->collection_;
              pwVar14 = (pNVar9->srv_cs_).
                        super__Vector_base<std::weak_ptr<miniros::ServiceClient::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceClient::Impl>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pwVar6 = (pNVar9->srv_cs_).
                       super__Vector_base<std::weak_ptr<miniros::ServiceClient::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceClient::Impl>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              do {
                if (pwVar14 == pwVar6) {
                  this->ok_ = false;
                  return (int)pNVar9;
                }
                p_Var10 = (pwVar14->
                          super___weak_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>
                          )._M_refcount._M_pi;
                if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  pNVar9 = (NodeHandleBackingCollection *)(ulong)(uint)p_Var10->_M_use_count;
                  do {
                    uVar8 = (uint)pNVar9;
                    if (uVar8 == 0) {
                      p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      break;
                    }
                    LOCK();
                    uVar2 = p_Var10->_M_use_count;
                    if (uVar8 == uVar2) {
                      p_Var10->_M_use_count = uVar8 + 1;
                    }
                    else {
                      pNVar9 = (NodeHandleBackingCollection *)(ulong)uVar2;
                    }
                    UNLOCK();
                  } while (uVar8 != uVar2);
                }
                if (p_Var10 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  pNVar9 = (NodeHandleBackingCollection *)CONCAT71((int7)((ulong)pNVar9 >> 8),1);
                }
                else {
                  pNVar9 = (NodeHandleBackingCollection *)
                           (ulong)CONCAT31((int3)((uint)p_Var10->_M_use_count >> 8),
                                           p_Var10->_M_use_count == 0);
                }
                if (((char)pNVar9 == '\0') &&
                   (this_03 = (pwVar14->
                              super___weak_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr, this_03 != (Impl *)0x0)) {
                  uVar8 = ServiceClient::Impl::shutdown(this_03,__fd,__how);
                  pNVar9 = (NodeHandleBackingCollection *)(ulong)uVar8;
                  __how = extraout_EDX_05;
                }
                if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
                  pNVar9 = extraout_RAX;
                  __how = extraout_EDX_06;
                }
                pwVar14 = pwVar14 + 1;
              } while( true );
            }
            p_Var10 = (pwVar13->
                      super___weak_ptr<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount._M_pi;
            if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              iVar7 = p_Var10->_M_use_count;
              do {
                if (iVar7 == 0) {
                  p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  break;
                }
                LOCK();
                iVar1 = p_Var10->_M_use_count;
                bVar15 = iVar7 == iVar1;
                if (bVar15) {
                  p_Var10->_M_use_count = iVar7 + 1;
                  iVar1 = iVar7;
                }
                iVar7 = iVar1;
                UNLOCK();
              } while (!bVar15);
            }
            if (p_Var10 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              bVar15 = true;
            }
            else {
              bVar15 = p_Var10->_M_use_count == 0;
            }
            if ((!bVar15) &&
               (this_02 = (pwVar13->
                          super___weak_ptr<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr, this_02 != (Impl *)0x0)) {
              ServiceServer::Impl::unadvertise(this_02);
              __how = extraout_EDX_03;
            }
            if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
              __how = extraout_EDX_04;
            }
            pwVar13 = pwVar13 + 1;
          } while( true );
        }
        p_Var10 = (pwVar12->super___weak_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          iVar7 = p_Var10->_M_use_count;
          do {
            if (iVar7 == 0) {
              p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              break;
            }
            LOCK();
            iVar1 = p_Var10->_M_use_count;
            bVar15 = iVar7 == iVar1;
            if (bVar15) {
              p_Var10->_M_use_count = iVar7 + 1;
              iVar1 = iVar7;
            }
            iVar7 = iVar1;
            UNLOCK();
          } while (!bVar15);
        }
        if (p_Var10 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          bVar15 = true;
        }
        else {
          bVar15 = p_Var10->_M_use_count == 0;
        }
        if ((!bVar15) &&
           (this_01 = (pwVar12->
                      super___weak_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
           , this_01 != (Impl *)0x0)) {
          Publisher::Impl::unadvertise(this_01);
          __how = extraout_EDX_01;
        }
        if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
          __how = extraout_EDX_02;
        }
        pwVar12 = pwVar12 + 1;
      } while( true );
    }
    p_Var10 = (pwVar11->super___weak_ptr<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar7 = p_Var10->_M_use_count;
      do {
        if (iVar7 == 0) {
          p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          break;
        }
        LOCK();
        iVar1 = p_Var10->_M_use_count;
        bVar15 = iVar7 == iVar1;
        if (bVar15) {
          p_Var10->_M_use_count = iVar7 + 1;
          iVar1 = iVar7;
        }
        iVar7 = iVar1;
        UNLOCK();
      } while (!bVar15);
    }
    if (p_Var10 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar15 = true;
    }
    else {
      bVar15 = p_Var10->_M_use_count == 0;
    }
    if ((!bVar15) &&
       (this_00 = (pwVar11->super___weak_ptr<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2>)
                  ._M_ptr, this_00 != (Impl *)0x0)) {
      Subscriber::Impl::unsubscribe(this_00);
      __how = extraout_EDX;
    }
    if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
      __how = extraout_EDX_00;
    }
    pwVar11 = pwVar11 + 1;
  } while( true );
}

Assistant:

void NodeHandle::shutdown()
{
  {
    NodeHandleBackingCollection::V_SubImpl::iterator it = collection_->subs_.begin();
    NodeHandleBackingCollection::V_SubImpl::iterator end = collection_->subs_.end();
    for (; it != end; ++it)
    {
      Subscriber::ImplPtr impl = it->lock();

      if (impl)
      {
        impl->unsubscribe();
      }
    }
  }

  {
    NodeHandleBackingCollection::V_PubImpl::iterator it = collection_->pubs_.begin();
    NodeHandleBackingCollection::V_PubImpl::iterator end = collection_->pubs_.end();
    for (; it != end; ++it)
    {
      Publisher::ImplPtr impl = it->lock();

      if (impl)
      {
        impl->unadvertise();
      }
    }
  }

  {
    NodeHandleBackingCollection::V_SrvImpl::iterator it = collection_->srvs_.begin();
    NodeHandleBackingCollection::V_SrvImpl::iterator end = collection_->srvs_.end();
    for (; it != end; ++it)
    {
      ServiceServer::ImplPtr impl = it->lock();

      if (impl)
      {
        impl->unadvertise();
      }
    }
  }

  {
    NodeHandleBackingCollection::V_SrvCImpl::iterator it = collection_->srv_cs_.begin();
    NodeHandleBackingCollection::V_SrvCImpl::iterator end = collection_->srv_cs_.end();
    for (; it != end; ++it)
    {
      ServiceClient::ImplPtr impl = it->lock();

      if (impl)
      {
        impl->shutdown();
      }
    }
  }

  ok_ = false;
}